

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::add_interface_block_pointer
          (CompilerMSL *this,uint32_t ib_var_id,StorageClass storage)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ExecutionModel EVar5;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  char (*ts_1) [7];
  ID id;
  ID *__k;
  StorageClass SVar10;
  uint32_t ib_ptr_ptr_type_id;
  uint32_t local_7c;
  uint32_t local_78;
  StorageClass local_74;
  long local_70;
  string local_68;
  char *local_48;
  uint32_t local_40;
  key_type local_3c;
  ulong local_38;
  
  if (ib_var_id == 0) {
    id.id = 0;
  }
  else {
    local_74 = storage;
    uVar4 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
    pSVar6 = Compiler::expression_type((Compiler *)this,ib_var_id);
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar5 == ExecutionModelTessellationControl) ||
       ((EVar5 = Compiler::get_execution_model((Compiler *)this),
        EVar5 == ExecutionModelTessellationEvaluation &&
        ((this->msl_options).raw_buffer_tese_input == true)))) {
      local_40 = uVar4 + 1;
      local_78 = uVar4;
      pSVar7 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                         ((Compiler *)this,uVar4,pSVar6);
      *(undefined4 *)&(pSVar7->super_IVariant).field_0xc = 0x20;
      uVar3 = (pSVar6->super_IVariant).self.id;
      (pSVar7->type_alias).id = uVar3;
      (pSVar7->parent_type).id = uVar3;
      pSVar7->pointer = true;
      pSVar7->pointer_depth = pSVar7->pointer_depth + 1;
      __k = &(pSVar6->super_IVariant).self;
      SVar10 = StorageClassStorageBuffer;
      local_38 = (ulong)uVar4;
      if (storage == StorageClassInput) {
        EVar5 = Compiler::get_execution_model((Compiler *)this);
        if ((EVar5 != ExecutionModelTessellationControl) ||
           ((this->msl_options).multi_patch_workgroup == false)) {
          EVar5 = Compiler::get_execution_model((Compiler *)this);
          SVar10 = StorageClassWorkgroup;
          if (EVar5 == ExecutionModelTessellationEvaluation) {
            SVar10 = (uint)(this->msl_options).raw_buffer_tese_input * 8 + StorageClassWorkgroup;
          }
        }
        local_48 = "gl_in";
        local_70 = 5;
      }
      else {
        local_48 = "gl_out";
        local_70 = 6;
      }
      pSVar7->storage = SVar10;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,__k);
      local_68._M_dataplus._M_p._0_4_ = local_78;
      pmVar9 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,(key_type *)&local_68);
      Meta::operator=(pmVar9,pmVar8);
      uVar4 = local_40;
      id.id = (int)local_38 + 2;
      local_7c = local_40;
      pSVar6 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,local_40,pSVar7);
      (pSVar6->parent_type).id = local_78;
      (pSVar6->type_alias).id = __k->id;
      pSVar6->storage = StorageClassFunction;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,__k);
      local_68._M_dataplus._M_p._0_4_ = uVar4;
      pmVar9 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,(key_type *)&local_68);
      Meta::operator=(pmVar9,pmVar8);
      local_68._M_dataplus._M_p._0_4_ = 7;
      local_3c.id = 0;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                ((Compiler *)this,id.id,&local_7c,(StorageClass *)&local_68,(int *)&local_3c);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,local_48,local_48 + local_70);
      Compiler::set_name((Compiler *)this,id,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if (local_74 == StorageClassInput) {
        Compiler::set_decoration((Compiler *)this,id,DecorationNonWritable,0);
      }
    }
    else {
      id.id = uVar4 + 1;
      local_7c = uVar4;
      pSVar7 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                         ((Compiler *)this,uVar4,pSVar6);
      pSVar7->basetype = ControlPointArray;
      uVar3 = (pSVar6->super_IVariant).self.id;
      (pSVar7->type_alias).id = uVar3;
      (pSVar7->parent_type).id = uVar3;
      pSVar7->storage = storage;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,&(pSVar6->super_IVariant).self);
      local_68._M_dataplus._M_p._0_4_ = uVar4;
      pmVar9 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,(key_type *)&local_68);
      Meta::operator=(pmVar9,pmVar8);
      local_68._M_dataplus._M_p = (pointer)((ulong)local_68._M_dataplus._M_p._4_4_ << 0x20);
      ts_1 = (char (*) [7])&local_74;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&,int>
                ((Compiler *)this,id.id,&local_7c,(StorageClass *)ts_1,(int *)&local_68);
      paVar2 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"gl_in","");
      Compiler::set_name((Compiler *)this,id,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      join<std::__cxx11::string&,char_const(&)[7]>
                (&local_68,(spirv_cross *)&this->patch_stage_in_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".gl_in",ts_1)
      ;
      local_3c.id = id.id;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,&local_3c);
      ::std::__cxx11::string::operator=
                ((string *)&(pmVar8->decoration).qualified_alias,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  return id.id;
}

Assistant:

uint32_t CompilerMSL::add_interface_block_pointer(uint32_t ib_var_id, StorageClass storage)
{
	if (!ib_var_id)
		return 0;

	uint32_t ib_ptr_var_id;
	uint32_t next_id = ir.increase_bound_by(3);
	auto &ib_type = expression_type(ib_var_id);
	if (is_tesc_shader() || (is_tese_shader() && msl_options.raw_buffer_tese_input))
	{
		// Tessellation control per-vertex I/O is presented as an array, so we must
		// do the same with our struct here.
		uint32_t ib_ptr_type_id = next_id++;
		auto &ib_ptr_type = set<SPIRType>(ib_ptr_type_id, ib_type);
		ib_ptr_type.op = OpTypePointer;
		ib_ptr_type.parent_type = ib_ptr_type.type_alias = ib_type.self;
		ib_ptr_type.pointer = true;
		ib_ptr_type.pointer_depth++;
		ib_ptr_type.storage = storage == StorageClassInput ?
		                          ((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		                                   (is_tese_shader() && msl_options.raw_buffer_tese_input) ?
		                               StorageClassStorageBuffer :
		                               StorageClassWorkgroup) :
		                          StorageClassStorageBuffer;
		ir.meta[ib_ptr_type_id] = ir.meta[ib_type.self];
		// To ensure that get_variable_data_type() doesn't strip off the pointer,
		// which we need, use another pointer.
		uint32_t ib_ptr_ptr_type_id = next_id++;
		auto &ib_ptr_ptr_type = set<SPIRType>(ib_ptr_ptr_type_id, ib_ptr_type);
		ib_ptr_ptr_type.parent_type = ib_ptr_type_id;
		ib_ptr_ptr_type.type_alias = ib_type.self;
		ib_ptr_ptr_type.storage = StorageClassFunction;
		ir.meta[ib_ptr_ptr_type_id] = ir.meta[ib_type.self];

		ib_ptr_var_id = next_id;
		set<SPIRVariable>(ib_ptr_var_id, ib_ptr_ptr_type_id, StorageClassFunction, 0);
		set_name(ib_ptr_var_id, storage == StorageClassInput ? "gl_in" : "gl_out");
		if (storage == StorageClassInput)
			set_decoration(ib_ptr_var_id, DecorationNonWritable);
	}
	else
	{
		// Tessellation evaluation per-vertex inputs are also presented as arrays.
		// But, in Metal, this array uses a very special type, 'patch_control_point<T>',
		// which is a container that can be used to access the control point data.
		// To represent this, a special 'ControlPointArray' type has been added to the
		// SPIRV-Cross type system. It should only be generated by and seen in the MSL
		// backend (i.e. this one).
		uint32_t pcp_type_id = next_id++;
		auto &pcp_type = set<SPIRType>(pcp_type_id, ib_type);
		pcp_type.basetype = SPIRType::ControlPointArray;
		pcp_type.parent_type = pcp_type.type_alias = ib_type.self;
		pcp_type.storage = storage;
		ir.meta[pcp_type_id] = ir.meta[ib_type.self];

		ib_ptr_var_id = next_id;
		set<SPIRVariable>(ib_ptr_var_id, pcp_type_id, storage, 0);
		set_name(ib_ptr_var_id, "gl_in");
		ir.meta[ib_ptr_var_id].decoration.qualified_alias = join(patch_stage_in_var_name, ".gl_in");
	}
	return ib_ptr_var_id;
}